

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hungarian_algorithm.h
# Opt level: O0

void __thiscall
hungarian_algorithm::
HungarianSolver<boost::chrono::duration<long,boost::ratio<1l,1l>>,unsigned_long,std::less<boost::chrono::duration<long,boost::ratio<1l,1l>>>>
::
copyAndNormalizeCosts<boost::numeric::ublas::matrix<boost::chrono::duration<long,boost::ratio<1l,1l>>,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,boost::ratio<1l,1l>>,std::allocator<boost::chrono::duration<long,boost::ratio<1l,1l>>>>>>
          (HungarianSolver<boost::chrono::duration<long,boost::ratio<1l,1l>>,unsigned_long,std::less<boost::chrono::duration<long,boost::ratio<1l,1l>>>>
           *this,matrix<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>_>
                 *cost_function)

{
  bool bVar1;
  const_reference pdVar2;
  reference pdVar3;
  duration<long,_boost::ratio<1L,_1L>_> *pdVar4;
  duration<long,_boost::ratio<1L,_1L>_> *pdVar5;
  byte local_189;
  byte local_179;
  bool local_161;
  reference local_160;
  reference local_150;
  reference local_140;
  reference local_130;
  reference local_120;
  reference local_110;
  duration<long,_boost::ratio<1L,_1L>_> local_100;
  duration<long,_boost::ratio<1L,_1L>_> *local_f8;
  duration<long,_boost::ratio<1L,_1L>_> *cost_3;
  size_t i_2;
  size_t row_2;
  duration<long,_boost::ratio<1L,_1L>_> cost_2;
  size_t i_1;
  size_t row_1;
  duration<long,_boost::ratio<1L,_1L>_> best_cost_1;
  size_t col_2;
  reference local_a8;
  reference local_98;
  reference local_88;
  reference local_78;
  reference local_68;
  duration<long,_boost::ratio<1L,_1L>_> local_58;
  duration<long,_boost::ratio<1L,_1L>_> *local_50;
  duration<long,_boost::ratio<1L,_1L>_> *cost_1;
  size_t col_1;
  duration<long,_boost::ratio<1L,_1L>_> cost;
  size_t col;
  duration<long,_boost::ratio<1L,_1L>_> best_cost;
  size_t row;
  size_t i;
  matrix<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>_>
  *cost_function_local;
  HungarianSolver<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_unsigned_long,_std::less<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>
  *this_local;
  
  if (*(ulong *)(this + 8) < *(ulong *)this) {
    for (best_cost_1.rep_ = 0; (ulong)best_cost_1.rep_ < *(ulong *)(this + 8);
        best_cost_1.rep_ = best_cost_1.rep_ + 1) {
      row_1 = *(size_t *)(this + 0xe0);
      cost_2 = best_cost_1;
      for (i_1 = 0; i_1 < *(ulong *)this; i_1 = i_1 + 1) {
        pdVar2 = boost::numeric::ublas::
                 matrix<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>_>
                 ::operator()(cost_function,i_1,best_cost_1.rep_);
        row_2 = pdVar2->rep_;
        pdVar3 = std::
                 vector<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>
                 ::operator[]((vector<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>
                               *)(this + 0xe8),cost_2.rep_);
        boost::chrono::duration<long,_boost::ratio<1L,_1L>_>::operator=
                  (pdVar3,(duration<long,_boost::ratio<1L,_1L>_> *)&row_2);
        if ((i_1 == 0) ||
           (bVar1 = std::less<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>::operator()
                              (*(less<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_> **)
                                (this + 0xd8),(duration<long,_boost::ratio<1L,_1L>_> *)&row_2,
                               (duration<long,_boost::ratio<1L,_1L>_> *)&row_1), bVar1)) {
          boost::chrono::duration<long,_boost::ratio<1L,_1L>_>::operator=
                    ((duration<long,_boost::ratio<1L,_1L>_> *)&row_1,
                     (duration<long,_boost::ratio<1L,_1L>_> *)&row_2);
        }
        cost_2.rep_ = *(long *)(this + 8) + cost_2.rep_;
      }
      cost_3 = (duration<long,_boost::ratio<1L,_1L>_> *)best_cost_1.rep_;
      for (i_2 = 0; i_2 < *(ulong *)this; i_2 = i_2 + 1) {
        local_f8 = std::
                   vector<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>
                   ::operator[]((vector<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>
                                 *)(this + 0xe8),(size_type)cost_3);
        pdVar4 = std::max<boost::chrono::duration<long,boost::ratio<1l,1l>>>
                           (local_f8,(duration<long,_boost::ratio<1L,_1L>_> *)&row_1);
        pdVar5 = std::min<boost::chrono::duration<long,boost::ratio<1l,1l>>>
                           (local_f8,(duration<long,_boost::ratio<1L,_1L>_> *)&row_1);
        local_100.rep_ = (rep)boost::chrono::operator-(pdVar4,pdVar5);
        boost::chrono::duration<long,_boost::ratio<1L,_1L>_>::operator=(local_f8,&local_100);
        bVar1 = boost::chrono::operator==
                          (local_f8,(duration<long,_boost::ratio<1L,_1L>_> *)(this + 0xe0));
        if (bVar1) {
          local_110 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                ((vector<bool,_std::allocator<bool>_> *)(this + 0x60),
                                 (size_type)cost_3);
          std::_Bit_reference::operator=(&local_110,true);
          local_120 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                ((vector<bool,_std::allocator<bool>_> *)(this + 0x10),i_2);
          bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_120);
          local_189 = 0;
          if (!bVar1) {
            local_130 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                  ((vector<bool,_std::allocator<bool>_> *)(this + 0x38),
                                   best_cost_1.rep_);
            bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_130);
            local_189 = bVar1 ^ 0xff;
          }
          if ((local_189 & 1) != 0) {
            local_140 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                  ((vector<bool,_std::allocator<bool>_> *)(this + 0x88),
                                   (size_type)cost_3);
            std::_Bit_reference::operator=(&local_140,true);
            local_150 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                  ((vector<bool,_std::allocator<bool>_> *)(this + 0x10),i_2);
            std::_Bit_reference::operator=(&local_150,true);
            local_160 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                  ((vector<bool,_std::allocator<bool>_> *)(this + 0x38),
                                   best_cost_1.rep_);
            std::_Bit_reference::operator=(&local_160,true);
          }
        }
        cost_3 = (duration<long,_boost::ratio<1L,_1L>_> *)
                 ((long)&cost_3->rep_ + *(long *)(this + 8));
      }
    }
  }
  else {
    row = 0;
    for (best_cost.rep_ = 0; (ulong)best_cost.rep_ < *(ulong *)this;
        best_cost.rep_ = best_cost.rep_ + 1) {
      col = *(size_t *)(this + 0xe0);
      for (cost.rep_ = 0; (ulong)cost.rep_ < *(ulong *)(this + 8); cost.rep_ = cost.rep_ + 1) {
        pdVar2 = boost::numeric::ublas::
                 matrix<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>_>
                 ::operator()(cost_function,best_cost.rep_,cost.rep_);
        col_1 = pdVar2->rep_;
        pdVar3 = std::
                 vector<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>
                 ::operator[]((vector<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>
                               *)(this + 0xe8),row);
        boost::chrono::duration<long,_boost::ratio<1L,_1L>_>::operator=
                  (pdVar3,(duration<long,_boost::ratio<1L,_1L>_> *)&col_1);
        if ((cost.rep_ == 0) ||
           (bVar1 = std::less<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>::operator()
                              (*(less<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_> **)
                                (this + 0xd8),(duration<long,_boost::ratio<1L,_1L>_> *)&col_1,
                               (duration<long,_boost::ratio<1L,_1L>_> *)&col), bVar1)) {
          boost::chrono::duration<long,_boost::ratio<1L,_1L>_>::operator=
                    ((duration<long,_boost::ratio<1L,_1L>_> *)&col,
                     (duration<long,_boost::ratio<1L,_1L>_> *)&col_1);
        }
        row = row + 1;
      }
      row = row - *(long *)(this + 8);
      for (cost_1 = (duration<long,_boost::ratio<1L,_1L>_> *)0x0;
          cost_1 < *(duration<long,_boost::ratio<1L,_1L>_> **)(this + 8);
          cost_1 = (duration<long,_boost::ratio<1L,_1L>_> *)((long)&cost_1->rep_ + 1)) {
        local_50 = std::
                   vector<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>
                   ::operator[]((vector<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>
                                 *)(this + 0xe8),row);
        pdVar4 = std::max<boost::chrono::duration<long,boost::ratio<1l,1l>>>
                           (local_50,(duration<long,_boost::ratio<1L,_1L>_> *)&col);
        pdVar5 = std::min<boost::chrono::duration<long,boost::ratio<1l,1l>>>
                           (local_50,(duration<long,_boost::ratio<1L,_1L>_> *)&col);
        local_58.rep_ = (rep)boost::chrono::operator-(pdVar4,pdVar5);
        boost::chrono::duration<long,_boost::ratio<1L,_1L>_>::operator=(local_50,&local_58);
        bVar1 = boost::chrono::operator==
                          (local_50,(duration<long,_boost::ratio<1L,_1L>_> *)(this + 0xe0));
        if (bVar1) {
          local_68 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               ((vector<bool,_std::allocator<bool>_> *)(this + 0x60),row);
          std::_Bit_reference::operator=(&local_68,true);
          local_78 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               ((vector<bool,_std::allocator<bool>_> *)(this + 0x10),best_cost.rep_)
          ;
          bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_78);
          local_179 = 0;
          if (!bVar1) {
            local_88 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                 ((vector<bool,_std::allocator<bool>_> *)(this + 0x38),
                                  (size_type)cost_1);
            bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_88);
            local_179 = bVar1 ^ 0xff;
          }
          if ((local_179 & 1) != 0) {
            local_98 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                 ((vector<bool,_std::allocator<bool>_> *)(this + 0x88),row);
            std::_Bit_reference::operator=(&local_98,true);
            local_a8 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                 ((vector<bool,_std::allocator<bool>_> *)(this + 0x10),
                                  best_cost.rep_);
            std::_Bit_reference::operator=(&local_a8,true);
            _col_2 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               ((vector<bool,_std::allocator<bool>_> *)(this + 0x38),
                                (size_type)cost_1);
            std::_Bit_reference::operator=((_Bit_reference *)&col_2,true);
          }
        }
        row = row + 1;
      }
    }
  }
  local_161 = false;
  std::vector<bool,_std::allocator<bool>_>::assign
            ((vector<bool,_std::allocator<bool>_> *)(this + 0x10),*(size_type *)this,&local_161);
  return;
}

Assistant:

void copyAndNormalizeCosts(const CostFunction& cost_function)
  {
    if (num_rows_ <= num_cols_)
    {
      // Copy costs from cost function and find best cost per row:
      std::size_t i = 0;
      for (std::size_t row = 0; row < num_rows_; ++row)
      {
        Cost best_cost(zero_cost_);
        for (std::size_t col = 0; col < num_cols_; ++col, ++i)
        {
          const Cost cost(cost_function(Size(row), Size(col)));
          cost_matrix_[i] = cost;
          if (col == 0 || cost_comparator_(cost, best_cost))
          {
            best_cost = cost;
          }
        }

        i -= num_cols_; // Reset index to beginning of row

        // Subtract best cost in row from each element (or vice-versa, depending on whether costs are maximized or
        // minimized) and star first zero found in row if column is not already covered:
        for (std::size_t col = 0; col < num_cols_; ++col, ++i)
        {
          Cost& cost = cost_matrix_[i];
          cost = std::max(cost, best_cost) - std::min(cost, best_cost);
          if (cost == zero_cost_)
          {
            zero_matrix_[i] = true;
            if (!covered_rows_[row] && !covered_cols_[col])
            {
              star_matrix_[i] = true;
              covered_rows_[row] = true;
              covered_cols_[col] = true;
            }
          }
        }
      }
    }
    else
    {
      // Copy costs from cost function and find best cost per column:
      for (std::size_t col = 0; col < num_cols_; ++col)
      {
        Cost best_cost(zero_cost_);
        for (std::size_t row = 0, i = col; row < num_rows_; ++row, i += num_cols_)
        {
          const Cost cost(cost_function(Size(row), Size(col)));
          cost_matrix_[i] = cost;
          if (row == 0 || cost_comparator_(cost, best_cost))
          {
            best_cost = cost;
          }
        }

        // Subtract best cost in column from each element (or vice-versa, depending on whether costs are maximized or
        // minimized) and star first zero found in column if column is not already covered:
        for (std::size_t row = 0, i = col; row < num_rows_; ++row, i += num_cols_)
        {
          Cost& cost = cost_matrix_[i];
          cost = std::max(cost, best_cost) - std::min(cost, best_cost);
          if (cost == zero_cost_)
          {
            zero_matrix_[i] = true;
            if (!covered_rows_[row] && !covered_cols_[col])
            {
              star_matrix_[i] = true;
              covered_rows_[row] = true;
              covered_cols_[col] = true;
            }
          }
        }
      }
    }
    covered_rows_.assign(num_rows_, false);
  }